

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

AActor * RoughBlockCheck(AActor *mo,int index,void *param)

{
  bool bVar1;
  FBlockNode *local_38;
  FBlockNode *link;
  bool onlyseekable;
  void *param_local;
  int index_local;
  AActor *mo_local;
  
  local_38 = blocklinks[index];
  while( true ) {
    if (local_38 == (FBlockNode *)0x0) {
      return (AActor *)0x0;
    }
    if ((local_38->Me != mo) &&
       (((param == (void *)0x0 || (bVar1 = AActor::CanSeek(mo,local_38->Me), bVar1)) &&
        (bVar1 = AActor::IsOkayToAttack(mo,local_38->Me), bVar1)))) break;
    local_38 = local_38->NextActor;
  }
  return local_38->Me;
}

Assistant:

static AActor *RoughBlockCheck (AActor *mo, int index, void *param)
{
	bool onlyseekable = param != NULL;
	FBlockNode *link;

	for (link = blocklinks[index]; link != NULL; link = link->NextActor)
	{
		if (link->Me != mo)
		{
			if (onlyseekable && !mo->CanSeek(link->Me))
			{
				continue;
			}
			if (mo->IsOkayToAttack (link->Me))
			{
				return link->Me;
			}
		}
	}
	return NULL;
}